

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_message.c
# Opt level: O2

TsStatus_t ts_message_decode_json(TsMessageRef_t message,cJSON *value)

{
  double dVar1;
  int iVar2;
  TsStatus_t TVar3;
  _Bool value_00;
  char *field;
  double dVar4;
  TsMessageRef_t content;
  
  TVar3 = TsStatusOk;
  for (; value != (cJSON *)0x0; value = value->next) {
    iVar2 = value->type;
    TVar3 = TsStatusErrorNotImplemented;
    switch(iVar2) {
    case 1:
      field = value->string;
      value_00 = false;
      goto LAB_001024a3;
    case 2:
      field = value->string;
      value_00 = true;
LAB_001024a3:
      TVar3 = ts_message_set_bool(message,field,value_00);
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      goto switchD_00102429_caseD_3;
    case 4:
      TVar3 = ts_message_set_null(message,value->string);
      break;
    case 8:
      dVar4 = (double)value->valueint;
      dVar1 = value->valuedouble;
      if ((dVar1 != dVar4) || (NAN(dVar1) || NAN(dVar4))) {
        TVar3 = ts_message_set_float(message,value->string,(float)dVar1);
      }
      else {
        TVar3 = ts_message_set_int(message,value->string,value->valueint);
      }
      break;
    default:
      if (iVar2 == 0x10) {
        TVar3 = ts_message_set_string(message,value->string,value->valuestring);
      }
      else {
        if (iVar2 != 0x40) {
          return TsStatusErrorNotImplemented;
        }
        TVar3 = ts_message_create_message(message,value->string,&content);
        if (TVar3 == TsStatusOk) {
          TVar3 = ts_message_decode_json(content,value->child);
        }
      }
    }
  }
switchD_00102429_caseD_3:
  return TVar3;
}

Assistant:

TsStatus_t ts_message_decode_json(TsMessageRef_t message, cJSON *value)
{
	/* decode each node in the current value */
	TsStatus_t status = TsStatusOk;
	while (value != NULL) {

		/* decode current node */
		switch (value->type) {

		case cJSON_NULL:
			status = ts_message_set_null(message, value->string);
			break;

		case cJSON_Number:
			if (value->valuedouble == (double) (value->valueint)) {
				status = ts_message_set_int(message, value->string, value->valueint);
			} else {
				status = ts_message_set_float(message, value->string, (float) (value->valuedouble));
			}
			break;

		case cJSON_String:
			status = ts_message_set_string(message, value->string, value->valuestring);
			break;

		case cJSON_True:
			status = ts_message_set_bool(message, value->string, true);
			break;

		case cJSON_False:
			status = ts_message_set_bool(message, value->string, false);
			break;

		case cJSON_Object: {

			TsMessageRef_t content;
			status = ts_message_create_message(message, value->string, &content);
			if (status == TsStatusOk) {
				status = ts_message_decode_json(content, value->child);
			}
			break;
		}
		case cJSON_Array:
			/* TODO */
			/* fallthrough */

		case cJSON_Invalid:
		case cJSON_Raw:
		default:
			return TsStatusErrorNotImplemented;
		}

		/* get next sibling */
		value = value->next;
	}
	return status;
}